

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder.h
# Opt level: O2

EnumDeclarationSymbol * __thiscall
psy::C::DeclarationBinder::bindDeclaration<psy::C::EnumDeclarationSymbol,psy::C::TagType*>
          (DeclarationBinder *this,SyntaxNode *node,TagType *args)

{
  tuple<psy::C::DeclarationSymbol_*,_std::default_delete<psy::C::DeclarationSymbol>_> this_00;
  Symbol *containingSym;
  EnumDeclarationSymbol *sym;
  _Elt_pointer ppSVar1;
  pointer __p;
  __uniq_ptr_impl<psy::C::DeclarationSymbol,_std::default_delete<psy::C::DeclarationSymbol>_>
  local_30;
  _Head_base<0UL,_psy::C::EnumDeclarationSymbol_*,_false> local_28;
  
  this_00.
  super__Tuple_impl<0UL,_psy::C::DeclarationSymbol_*,_std::default_delete<psy::C::DeclarationSymbol>_>
  .super__Head_base<0UL,_psy::C::DeclarationSymbol_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_psy::C::DeclarationSymbol_*,_std::default_delete<psy::C::DeclarationSymbol>_>
        )operator_new(0x28);
  containingSym = containingUnitOrDeclaration(this);
  ppSVar1 = (this->scopes_).c.super__Deque_base<psy::C::Scope_*,_std::allocator<psy::C::Scope_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppSVar1 ==
      (this->scopes_).c.super__Deque_base<psy::C::Scope_*,_std::allocator<psy::C::Scope_*>_>._M_impl
      .super__Deque_impl_data._M_finish._M_first) {
    ppSVar1 = (this->scopes_).c.super__Deque_base<psy::C::Scope_*,_std::allocator<psy::C::Scope_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  EnumDeclarationSymbol::EnumDeclarationSymbol
            ((EnumDeclarationSymbol *)
             this_00.
             super__Tuple_impl<0UL,_psy::C::DeclarationSymbol_*,_std::default_delete<psy::C::DeclarationSymbol>_>
             .super__Head_base<0UL,_psy::C::DeclarationSymbol_*,_false>._M_head_impl,containingSym,
             (this->super_SyntaxVisitor).tree_,ppSVar1[-1],args);
  local_28._M_head_impl = (EnumDeclarationSymbol *)0x0;
  local_30._M_t.
  super__Tuple_impl<0UL,_psy::C::DeclarationSymbol_*,_std::default_delete<psy::C::DeclarationSymbol>_>
  .super__Head_base<0UL,_psy::C::DeclarationSymbol_*,_false>._M_head_impl =
       (tuple<psy::C::DeclarationSymbol_*,_std::default_delete<psy::C::DeclarationSymbol>_>)
       (tuple<psy::C::DeclarationSymbol_*,_std::default_delete<psy::C::DeclarationSymbol>_>)
       this_00.
       super__Tuple_impl<0UL,_psy::C::DeclarationSymbol_*,_std::default_delete<psy::C::DeclarationSymbol>_>
       .super__Head_base<0UL,_psy::C::DeclarationSymbol_*,_false>._M_head_impl;
  sym = (EnumDeclarationSymbol *)
        SemanticModel::addDeclaration
                  (this->semaModel_,node,
                   (unique_ptr<psy::C::DeclarationSymbol,_std::default_delete<psy::C::DeclarationSymbol>_>
                    *)&local_30);
  if ((_Tuple_impl<0UL,_psy::C::DeclarationSymbol_*,_std::default_delete<psy::C::DeclarationSymbol>_>
       )local_30._M_t.
        super__Tuple_impl<0UL,_psy::C::DeclarationSymbol_*,_std::default_delete<psy::C::DeclarationSymbol>_>
        .super__Head_base<0UL,_psy::C::DeclarationSymbol_*,_false>._M_head_impl !=
      (DeclarationSymbol *)0x0) {
    (**(code **)(*(long *)local_30._M_t.
                          super__Tuple_impl<0UL,_psy::C::DeclarationSymbol_*,_std::default_delete<psy::C::DeclarationSymbol>_>
                          .super__Head_base<0UL,_psy::C::DeclarationSymbol_*,_false>._M_head_impl +
                8))();
  }
  local_30._M_t.
  super__Tuple_impl<0UL,_psy::C::DeclarationSymbol_*,_std::default_delete<psy::C::DeclarationSymbol>_>
  .super__Head_base<0UL,_psy::C::DeclarationSymbol_*,_false>._M_head_impl =
       (tuple<psy::C::DeclarationSymbol_*,_std::default_delete<psy::C::DeclarationSymbol>_>)
       (_Tuple_impl<0UL,_psy::C::DeclarationSymbol_*,_std::default_delete<psy::C::DeclarationSymbol>_>
        )0x0;
  pushDeclaration(this,(DeclarationSymbol *)sym);
  std::
  unique_ptr<psy::C::EnumDeclarationSymbol,_std::default_delete<psy::C::EnumDeclarationSymbol>_>::
  ~unique_ptr((unique_ptr<psy::C::EnumDeclarationSymbol,_std::default_delete<psy::C::EnumDeclarationSymbol>_>
               *)&local_28);
  return sym;
}

Assistant:

DeclSymT* DeclarationBinder::bindDeclaration(const SyntaxNode* node, DeclSymTArgs... args)
{
    std::unique_ptr<DeclSymT> newDecl(
                new DeclSymT(containingUnitOrDeclaration(),
                             tree_,
                             scopes_.top(),
                             std::forward<DeclSymTArgs>(args)...));
    auto decl = static_cast<DeclSymT*>(semaModel_->addDeclaration(node, std::move(newDecl)));
    pushDeclaration(decl);
    return decl;
}